

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O3

void __thiscall
chrono::ChProximityContainerMeshless::AccumulateStep2(ChProximityContainerMeshless *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _List_node_base *p_Var8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong uVar12;
  ulong uVar13;
  
  for (p_Var8 = (this->proximitylist).
                super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var8 != (_List_node_base *)&this->proximitylist; p_Var8 = p_Var8->_M_next) {
    lVar15 = (**(code **)((long)(p_Var8[1]._M_next)->_M_next + 0x18))();
    if (*(long *)(lVar15 + 0x10) == 0) {
      lVar15 = 0;
    }
    else {
      lVar15 = __dynamic_cast(*(long *)(lVar15 + 0x10),&ChContactable::typeinfo,
                              &fea::ChNodeMeshless::typeinfo,0x50);
    }
    lVar16 = (**(code **)((long)(p_Var8[1]._M_next)->_M_next + 0x20))();
    if (*(long *)(lVar16 + 0x10) == 0) {
      lVar16 = 0;
    }
    else {
      lVar16 = __dynamic_cast(*(long *)(lVar16 + 0x10),&ChContactable::typeinfo,
                              &fea::ChNodeMeshless::typeinfo,0x50);
    }
    uVar1 = *(ulong *)(lVar15 + 8);
    uVar2 = *(ulong *)(lVar15 + 0x10);
    uVar3 = *(ulong *)(lVar15 + 0x18);
    dVar37 = 0.0;
    dVar9 = *(double *)(lVar16 + 0x80) - *(double *)(lVar15 + 0x80);
    dVar32 = *(double *)(lVar16 + 0x78) - *(double *)(lVar15 + 0x78);
    dVar10 = *(double *)(lVar16 + 0x88) - *(double *)(lVar15 + 0x88);
    auVar17 = ZEXT816(0);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = *(ulong *)(lVar16 + 8);
    vmovsd_avx512f(auVar53);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *(ulong *)(lVar16 + 0x10);
    vmovsd_avx512f(auVar55);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = *(ulong *)(lVar16 + 0x18);
    vmovsd_avx512f(auVar57);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar9 * dVar9;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar32;
    auVar22 = vfmadd231sd_fma(auVar22,auVar19,auVar19);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar10;
    auVar22 = vfmadd231sd_fma(auVar22,auVar18,auVar18);
    auVar22 = vsqrtsd_avx(auVar22,auVar22);
    dVar31 = auVar22._0_8_;
    dVar21 = *(double *)(lVar15 + 0x2a8);
    uVar11 = *(ulong *)(lVar16 + 8);
    uVar12 = *(ulong *)(lVar16 + 0x10);
    uVar13 = *(ulong *)(lVar16 + 0x18);
    if (dVar31 < dVar21) {
      dVar20 = pow(dVar21,9.0);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar21;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar31 * dVar31;
      auVar22 = vfmsub231sd_fma(auVar23,auVar27,auVar27);
      dVar37 = pow(auVar22._0_8_,3.0);
      dVar37 = dVar37 * (315.0 / (dVar20 * 201.06192982974676));
      auVar17 = ZEXT816(0) << 0x40;
      uVar11 = local_50;
      uVar12 = local_58;
      uVar13 = local_60;
    }
    dVar21 = *(double *)(lVar16 + 0x2a8);
    if (dVar31 < dVar21) {
      dVar20 = pow(dVar21,9.0);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar21;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar31 * dVar31;
      auVar22 = vfmsub231sd_fma(auVar24,auVar28,auVar28);
      dVar21 = pow(auVar22._0_8_,3.0);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar21 * (315.0 / (dVar20 * 201.06192982974676));
      uVar11 = local_50;
      uVar12 = local_58;
      uVar13 = local_60;
    }
    dVar21 = dVar9 * dVar37;
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar17 = vxorpd_avx512vl(auVar17,auVar14);
    dVar31 = dVar32 * dVar37;
    dVar37 = dVar10 * dVar37;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(lVar15 + 0x150);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar31;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar21 * *(double *)(lVar15 + 0x158);
    auVar22 = vfmadd231sd_fma(auVar42,auVar29,auVar4);
    auVar30._8_8_ = dVar31;
    auVar30._0_8_ = dVar31;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(lVar15 + 0x160);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar37;
    auVar18 = vfmadd231sd_fma(auVar22,auVar38,auVar5);
    auVar39._8_8_ = dVar37;
    auVar39._0_8_ = dVar37;
    *(double *)(lVar15 + 0x290) = auVar18._0_8_ + *(double *)(lVar15 + 0x290);
    dVar37 = auVar17._0_8_;
    dVar32 = dVar32 * dVar37;
    dVar9 = dVar9 * dVar37;
    dVar10 = dVar10 * dVar37;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *(ulong *)(lVar15 + 0x128);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *(ulong *)(lVar15 + 0x120);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = *(ulong *)(lVar15 + 0x130);
    auVar22 = vmovhpd_avx(auVar48,*(undefined8 *)(lVar15 + 0x140));
    auVar17 = vmovhpd_avx(auVar47,*(undefined8 *)(lVar15 + 0x138));
    auVar46._8_8_ = dVar10;
    auVar46._0_8_ = dVar10;
    auVar45._8_8_ = dVar32;
    auVar45._0_8_ = dVar32;
    auVar33._0_8_ = auVar22._0_8_ * dVar21;
    auVar33._8_8_ = auVar22._8_8_ * dVar21;
    auVar17 = vfmadd213pd_fma(auVar30,auVar17,auVar33);
    auVar22 = vmovhpd_avx(auVar49,*(undefined8 *)(lVar15 + 0x148));
    auVar17 = vfmadd213pd_fma(auVar39,auVar22,auVar17);
    *(double *)(lVar15 + 0x280) = auVar17._0_8_ + *(double *)(lVar15 + 0x280);
    auVar22 = vshufpd_avx(auVar17,auVar17,1);
    *(double *)(lVar15 + 0x288) = auVar22._0_8_ + *(double *)(lVar15 + 0x288);
    auVar19 = vsubpd_avx(*(undefined1 (*) [16])(lVar16 + 0x280),auVar17);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(lVar16 + 0x150);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar9 * *(double *)(lVar16 + 0x158);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar32;
    auVar22 = vfmadd231sd_fma(auVar40,auVar44,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(lVar16 + 0x160);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar10;
    auVar53 = vfmadd231sd_fma(auVar22,auVar25,auVar7);
    *(double *)(lVar16 + 0x290) = (*(double *)(lVar16 + 0x290) - auVar18._0_8_) + auVar53._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)(lVar16 + 0x128);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(lVar16 + 0x120);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *(ulong *)(lVar16 + 0x130);
    auVar22 = vmovhpd_avx(auVar34,*(undefined8 *)(lVar16 + 0x140));
    auVar17 = vmovhpd_avx(auVar26,*(undefined8 *)(lVar16 + 0x138));
    auVar35._0_8_ = dVar9 * auVar22._0_8_;
    auVar35._8_8_ = dVar9 * auVar22._8_8_;
    auVar17 = vfmadd213pd_fma(auVar17,auVar45,auVar35);
    auVar22 = vmovhpd_avx(auVar43,*(undefined8 *)(lVar16 + 0x148));
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar3;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar13;
    auVar18 = vsubsd_avx512f(auVar58,auVar52);
    auVar22 = vfmadd213pd_fma(auVar22,auVar46,auVar17);
    *(double *)(lVar16 + 0x280) = auVar19._0_8_ + auVar22._0_8_;
    *(double *)(lVar16 + 0x288) = auVar19._8_8_ + auVar22._8_8_;
    auVar22 = vsubpd_avx(*(undefined1 (*) [16])(lVar15 + 0x280),auVar22);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar1;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar11;
    auVar17 = vsubsd_avx512f(auVar54,auVar50);
    *(undefined1 (*) [16])(lVar15 + 0x280) = auVar22;
    dVar37 = *(double *)(lVar15 + 0x290) - auVar53._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar2;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar12;
    auVar19 = vsubsd_avx512f(auVar56,auVar51);
    *(double *)(lVar15 + 0x290) = dVar37;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auVar19._0_8_ * auVar19._0_8_;
    auVar17 = vfmadd231sd_fma(auVar41,auVar17,auVar17);
    dVar32 = 0.0;
    auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    dVar21 = *(double *)(lVar15 + 0x2a8);
    if (auVar17._0_8_ < dVar21) {
      dVar37 = pow(dVar21,6.0);
      auVar22 = *(undefined1 (*) [16])(lVar15 + 0x280);
      dVar32 = (dVar21 - auVar17._0_8_) * (45.0 / (dVar37 * 3.141592653589793));
      dVar37 = *(double *)(lVar15 + 0x290);
    }
    dVar32 = dVar32 * (*(double *)(*(long *)(lVar15 + 0x70) + 0xa0) +
                      *(double *)(*(long *)(lVar16 + 0x70) + 0xa0)) * 0.5 *
                      *(double *)(lVar15 + 0x298) * *(double *)(lVar16 + 0x298);
    auVar17 = vsubpd_avx(*(undefined1 (*) [16])(lVar16 + 0x20),*(undefined1 (*) [16])(lVar15 + 0x20)
                        );
    dVar21 = (*(double *)(lVar16 + 0x30) - *(double *)(lVar15 + 0x30)) * dVar32;
    auVar36._0_8_ = auVar17._0_8_ * dVar32;
    auVar36._8_8_ = auVar17._8_8_ * dVar32;
    *(double *)(lVar15 + 0x280) = auVar22._0_8_ + auVar36._0_8_;
    *(double *)(lVar15 + 0x288) = auVar22._8_8_ + auVar36._8_8_;
    *(double *)(lVar15 + 0x290) = dVar21 + dVar37;
    auVar22 = vsubpd_avx(*(undefined1 (*) [16])(lVar16 + 0x280),auVar36);
    *(undefined1 (*) [16])(lVar16 + 0x280) = auVar22;
    *(double *)(lVar16 + 0x290) = *(double *)(lVar16 + 0x290) - dVar21;
  }
  return;
}

Assistant:

void ChProximityContainerMeshless::AccumulateStep2() {
    // Per-edge data computation (transfer stress to forces)
    std::list<ChProximityMeshless*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        ChNodeMeshless* mnodeA = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelA()->GetContactable());
        ChNodeMeshless* mnodeB = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelB()->GetContactable());

        ChVector<> x_A = mnodeA->GetPos();
        ChVector<> x_B = mnodeB->GetPos();
        ChVector<> x_Aref = mnodeA->GetPosReference();
        ChVector<> x_Bref = mnodeB->GetPosReference();

        ChVector<> d_BA = x_Bref - x_Aref;

        double dist_BA = d_BA.Length();
        double W_BA = W_sph(dist_BA, mnodeA->GetKernelRadius());
        double W_AB = W_sph(dist_BA, mnodeB->GetKernelRadius());

        // increment elastoplastic forces of connected nodes

        mnodeA->UserForce += mnodeA->FA * (d_BA * W_BA);
        mnodeB->UserForce -= mnodeA->FA * (d_BA * W_BA);

        mnodeB->UserForce += mnodeB->FA * (d_BA * (-W_AB));
        mnodeA->UserForce -= mnodeB->FA * (d_BA * (-W_AB));

        // increment viscous forces..

        ChVector<> r_BA = x_B - x_A;
        double r_length = r_BA.Length();
        double W_BA_visc = W_sq_visco(r_length, mnodeA->GetKernelRadius());
        ChVector<> velBA = mnodeB->GetPos_dt() - mnodeA->GetPos_dt();

        double avg_viscosity =
            0.5 * (mnodeA->GetMatterContainer()->GetViscosity() + mnodeB->GetMatterContainer()->GetViscosity());

        ChVector<> viscforceBA = velBA * (mnodeA->volume * avg_viscosity * mnodeB->volume * W_BA_visc);
        mnodeA->UserForce += viscforceBA;
        mnodeB->UserForce -= viscforceBA;

        ++iterproximity;
    }
}